

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void __thiscall masc::polygon::c_ply::destroy(c_ply *this)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_31;
  ply_vertex *n;
  ply_vertex *ptr;
  c_ply *this_local;
  ply_vertex *ppVar2;
  
  if (this->head != (ply_vertex *)0x0) {
    n = this->head;
    do {
      iVar1 = (*n->_vptr_ply_vertex[3])();
      ppVar2 = (ply_vertex *)CONCAT44(extraout_var,iVar1);
      if (n != (ply_vertex *)0x0) {
        (*n->_vptr_ply_vertex[1])();
      }
      local_31 = ppVar2 != this->head && ppVar2 != (ply_vertex *)0x0;
      n = ppVar2;
    } while (local_31);
    this->tail = (ply_vertex *)0x0;
    this->head = (ply_vertex *)0x0;
    std::vector<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::clear
              (&this->all);
  }
  return;
}

Assistant:

void c_ply::destroy()
{
    if( head==NULL ) return;
    ply_vertex* ptr=head;
    do{
        ply_vertex * n=ptr->getNext();
        delete ptr;
        ptr=n;
    }
    while( ptr!=head && ptr!=NULL);
    head=tail=NULL;

    all.clear();
}